

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRoberts_dns.c
# Opt level: O1

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  
  pdVar1 = *(double **)((long)y->content + 0x10);
  dVar2 = pdVar1[1];
  dVar3 = *pdVar1 * -0.04 + dVar2 * 10000.0 * pdVar1[2];
  pdVar1 = *(double **)((long)ydot->content + 0x10);
  *pdVar1 = dVar3;
  dVar2 = dVar2 * 30000000.0 * dVar2;
  pdVar1[2] = dVar2;
  pdVar1[1] = -dVar3 - dVar2;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype y1, y2, y3, yd1, yd3;

  y1 = Ith(y, 1);
  y2 = Ith(y, 2);
  y3 = Ith(y, 3);

  yd1 = Ith(ydot, 1) = SUN_RCONST(-0.04) * y1 + SUN_RCONST(1.0e4) * y2 * y3;
  yd3 = Ith(ydot, 3) = SUN_RCONST(3.0e7) * y2 * y2;
  Ith(ydot, 2)       = -yd1 - yd3;

  return (0);
}